

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::ComputeDirections
               (int side,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *sidevectors)

{
  ostream *poVar1;
  int64_t iVar2;
  int *piVar3;
  TPZVec<int> *in_RCX;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  undefined4 in_EDI;
  int ip_5;
  int diff_5;
  int fim_5;
  int inicio_5;
  int ip_4;
  int diff_4;
  int fim_4;
  int inicio_4;
  int ip_3;
  int diff_3;
  int fim_3;
  int inicio_3;
  int ip_2;
  int diff_2;
  int fim_2;
  int inicio_2;
  int ip_1;
  int diff_1;
  int fim_1;
  int inicio_1;
  int ip;
  int diff;
  int fim;
  int inicio;
  int col;
  int lin;
  TPZFMatrix<double> t2vec;
  TPZFMatrix<double> t1vec;
  int numvec;
  TPZFMatrix<double> bvec;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int iVar4;
  int64_t in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  TPZFMatrix<double> *in_stack_fffffffffffffd50;
  int64_t in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  TPZFMatrix<double> *in_stack_fffffffffffffd70;
  int local_250;
  int local_240;
  int local_230;
  int local_220;
  int local_210;
  int local_200;
  int local_1f0;
  int local_1ec;
  TPZBaseMatrix local_b0 [4];
  TPZVec<int> *local_20;
  long *local_18;
  TPZBaseMatrix *local_10;
  undefined4 local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "static void pztopology::TPZPrism::ComputeDirections(int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZVec<int> &)"
                          );
  std::operator<<(poVar1,"Deprecated method, not compatible with Piola transform\n");
  pzinternal::DebugStopImpl((char *)t2vec.fPivot.fExtAlloc._8_8_,t2vec.fPivot.fExtAlloc._0_8_);
  iVar2 = TPZBaseMatrix::Cols(local_10);
  if (iVar2 != 3) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Gradient dimensions are not compatible with this topology");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)t2vec.fPivot.fExtAlloc._8_8_,t2vec.fPivot.fExtAlloc._0_8_);
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd70,CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
             ,in_stack_fffffffffffffd60);
  iVar2 = TPZBaseMatrix::Cols(local_b0);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd70,CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
             ,in_stack_fffffffffffffd60);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd70,CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
             ,in_stack_fffffffffffffd60);
  (**(code **)(*local_18 + 0x70))(local_18,3,(long)(int)iVar2);
  for (local_1ec = 0; local_1ec < (int)iVar2; local_1ec = local_1ec + 1) {
    for (local_1f0 = 0; local_1f0 < 3; local_1f0 = local_1f0 + 1) {
      TPZFMatrix<double>::PutVal
                (in_stack_fffffffffffffd50,
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      TPZFMatrix<double>::PutVal
                (in_stack_fffffffffffffd50,
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      TPZFMatrix<double>::PutVal
                (in_stack_fffffffffffffd50,
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
  }
  switch(local_4) {
  case 0xf:
    (**(code **)(*local_18 + 0x68))(local_18,3,7);
    (*local_20->_vptr_TPZVec[3])(local_20,7);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_200 = 0; local_200 < 7; local_200 = local_200 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)local_200 * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_200);
      *piVar3 = iVar4;
    }
    break;
  case 0x10:
    (**(code **)(*local_18 + 0x68))(local_18,3,9);
    (*local_20->_vptr_TPZVec[3])(local_20,9);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_210 = 0; local_210 < 9; local_210 = local_210 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)(local_210 + 7) * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_210);
      *piVar3 = iVar4;
    }
    break;
  case 0x11:
    (**(code **)(*local_18 + 0x68))(local_18,3,9);
    (*local_20->_vptr_TPZVec[3])(local_20,9);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_220 = 0; local_220 < 9; local_220 = local_220 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)(local_220 + 0x10) * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_220);
      *piVar3 = iVar4;
    }
    break;
  case 0x12:
    (**(code **)(*local_18 + 0x68))(local_18,3,9);
    (*local_20->_vptr_TPZVec[3])(local_20,9);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_230 = 0; local_230 < 9; local_230 = local_230 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)(local_230 + 0x19) * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_230);
      *piVar3 = iVar4;
    }
    break;
  case 0x13:
    (**(code **)(*local_18 + 0x68))(local_18,3,7);
    (*local_20->_vptr_TPZVec[3])(local_20,7);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_240 = 0; local_240 < 7; local_240 = local_240 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)(local_240 + 0x22) * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_240);
      *piVar3 = iVar4;
    }
    break;
  case 0x14:
    (**(code **)(*local_18 + 0x68))(local_18,3,0x16);
    (*local_20->_vptr_TPZVec[3])(local_20,0x16);
    computedirectionsPr(bvec.fPivot.fExtAlloc[1],bvec.fPivot.fExtAlloc[0],
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNAlloc,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fNElements,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>.fStore,
                        (TPZFMatrix<double> *)bvec.fPivot.super_TPZVec<int>._vptr_TPZVec,
                        (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_250 = 0; local_250 < 0x16; local_250 = local_250 + 1) {
      iVar4 = *(int *)(vectorsideorderPr + (long)(local_250 + 0x29) * 4);
      piVar3 = TPZVec<int>::operator[](local_20,(long)local_250);
      *piVar3 = iVar4;
    }
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1514e3f);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1514e4c);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1514e59);
  return;
}

Assistant:

void TPZPrism::ComputeDirections(int side, TPZFMatrix<REAL> &gradx, TPZFMatrix<REAL> &directions, TPZVec<int> &sidevectors)
    {
        // this method is out of date
        std::cout << __PRETTY_FUNCTION__ << "Deprecated method, not compatible with Piola transform\n";
        DebugStop();

        if(gradx.Cols()!=3)
        { std::cout << "Gradient dimensions are not compatible with this topology" << std::endl;
            DebugStop();
        }
        TPZFMatrix<REAL> bvec(3,63);
        int numvec = bvec.Cols();
        TPZFMatrix<REAL> t1vec(3,numvec);
        TPZFMatrix<REAL> t2vec(3,numvec);
        
        directions.Redim(3, numvec);
        for (int lin = 0; lin<numvec; lin++)
        {
            for(int col = 0;col<3;col++)
            {
                bvec.PutVal(col, lin, bPrism[lin][col]);
                t1vec.PutVal(col, lin, t1Prism[lin][col]);
                t2vec.PutVal(col, lin, t2Prism[lin][col]);
            }
        }
        
        // calcula os vetores
        switch (side) {
            case 15:
            {
                directions.Resize(3, 7);
                sidevectors.Resize(7);
                int inicio = 0, fim = 6;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 16:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 7, fim = 15;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 17:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 16, fim = 24;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 18:
            {
                directions.Resize(3, 9);
                sidevectors.Resize(9);
                int inicio = 25, fim = 33;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 19:
            {
                directions.Resize(3, 7);
                sidevectors.Resize(7);
                int inicio = 34, fim = 40;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
            case 20:
            {
                directions.Resize(3, 22);
                sidevectors.Resize(22);
                int inicio = 41, fim = 62;
                computedirectionsPr( inicio, fim, bvec, t1vec, t2vec, gradx, directions);
                int diff = fim-inicio+1;
                for (int ip = 0; ip < diff; ip++) {
                    sidevectors[ip] = vectorsideorderPr[ip+inicio];
                }
            }
                break;
                
            default:
                break;
        }

                
	}